

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

int aom_vector_var_c(int16_t *ref,int16_t *src,int bwl)

{
  int iVar1;
  uint mean_abs;
  int diff;
  int var;
  int mean;
  int sse;
  int width;
  int i;
  int bwl_local;
  int16_t *src_local;
  int16_t *ref_local;
  
  sse = 0;
  mean = 0;
  for (i = 0; i < 4 << ((byte)bwl & 0x1f); i = i + 1) {
    iVar1 = (int)ref[i] - (int)src[i];
    mean = iVar1 + mean;
    sse = iVar1 * iVar1 + sse;
  }
  if (mean < 1) {
    mean = -mean;
  }
  return sse - ((uint)(mean * mean) >> ((byte)bwl + 2 & 0x1f));
}

Assistant:

int aom_vector_var_c(const int16_t *ref, const int16_t *src, int bwl) {
  int i;
  int width = 4 << bwl;
  int sse = 0, mean = 0, var;

  for (i = 0; i < width; ++i) {
    int diff = ref[i] - src[i];  // diff: dynamic range [-510, 510], 10 bits.
    mean += diff;                // mean: dynamic range 16 bits.
    sse += diff * diff;          // sse:  dynamic range 26 bits.
  }

  // (mean * mean): dynamic range 31 bits.
  // If width == 128, the mean can be 510 * 128 = 65280, and log2(65280 ** 2) ~=
  // 31.99, so it needs to be casted to unsigned int to compute its square.
  const unsigned int mean_abs = abs(mean);
  var = sse - ((mean_abs * mean_abs) >> (bwl + 2));
  return var;
}